

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_File_set_view
              (MPIABI_File fh,MPIABI_Offset disp,MPIABI_Datatype etype,MPIABI_Datatype filetype,
              char *datarep,MPIABI_Info info)

{
  MPIABI_Info MVar1;
  MPIABI_Datatype MVar2;
  int iVar3;
  ompi_file_t *poVar4;
  ompi_datatype_t *poVar5;
  ompi_datatype_t *poVar6;
  ompi_info_t *poVar7;
  WPI_Handle<ompi_info_t_*> local_58;
  WPI_Handle<ompi_datatype_t_*> local_50;
  WPI_Handle<ompi_datatype_t_*> local_48;
  WPI_Handle<ompi_file_t_*> local_40;
  MPIABI_Info local_38;
  MPIABI_Info info_local;
  char *datarep_local;
  MPIABI_Datatype filetype_local;
  MPIABI_Datatype etype_local;
  MPIABI_Offset disp_local;
  MPIABI_File fh_local;
  
  local_38 = info;
  info_local = (MPIABI_Info)datarep;
  datarep_local = (char *)filetype;
  filetype_local = etype;
  etype_local = disp;
  disp_local = fh;
  WPI_Handle<ompi_file_t_*>::WPI_Handle(&local_40,fh);
  poVar4 = WPI_Handle::operator_cast_to_ompi_file_t_((WPI_Handle *)&local_40);
  MVar2 = etype_local;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_48,filetype_local);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_48);
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_50,(uintptr_t)datarep_local);
  poVar6 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_50);
  MVar1 = info_local;
  WPI_Handle<ompi_info_t_*>::WPI_Handle(&local_58,local_38);
  poVar7 = WPI_Handle::operator_cast_to_ompi_info_t_((WPI_Handle *)&local_58);
  iVar3 = MPI_File_set_view(poVar4,MVar2,poVar5,poVar6,MVar1,poVar7);
  return iVar3;
}

Assistant:

int MPIABI_File_set_view(
  MPIABI_File fh,
  MPIABI_Offset disp,
  MPIABI_Datatype etype,
  MPIABI_Datatype filetype,
  const char * datarep,
  MPIABI_Info info
) {
  return MPI_File_set_view(
    (MPI_File)(WPI_File)fh,
    (MPI_Offset)(WPI_Offset)disp,
    (MPI_Datatype)(WPI_Datatype)etype,
    (MPI_Datatype)(WPI_Datatype)filetype,
    datarep,
    (MPI_Info)(WPI_Info)info
  );
}